

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_algs.cc
# Opt level: O3

void CB_ALGS::predict_or_learn<false>(cb *data,single_learner *base,example *ec)

{
  label *cs_ld;
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  size_t sVar7;
  cb_class *pcVar8;
  ostream *poVar9;
  long lVar10;
  ulong uVar11;
  label ld;
  label local_48;
  
  local_48.costs._begin = (cb_class *)(ec->l).cs.costs._begin;
  local_48.costs._end = (cb_class *)(ec->l).cs.costs._end;
  local_48.costs.end_array = (cb_class *)(ec->l).cs.costs.end_array;
  local_48.costs.erase_count = (ec->l).cs.costs.erase_count;
  pcVar8 = GEN_CS::get_observed_cost(&local_48);
  (data->cbcs).known_cost = pcVar8;
  if ((pcVar8 != (cb_class *)0x0) && ((data->cbcs).num_actions <= pcVar8->action - 1)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"invalid action: ",0x10);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  cs_ld = &data->cb_cs_ld;
  GEN_CS::gen_cs_example<false>(&data->cbcs,ec,&local_48,cs_ld);
  if ((data->cbcs).cb_type != 1) {
    fVar1 = *(float *)&(cs_ld->costs)._begin;
    fVar2 = *(float *)((long)&(data->cb_cs_ld).costs._begin + 4);
    fVar3 = *(float *)&(data->cb_cs_ld).costs._end;
    uVar4 = *(undefined4 *)((long)&(data->cb_cs_ld).costs._end + 4);
    uVar5 = *(undefined4 *)((long)&(data->cb_cs_ld).costs.end_array + 4);
    sVar7 = (data->cb_cs_ld).costs.erase_count;
    uVar6 = *(undefined4 *)((long)&(data->cb_cs_ld).costs.erase_count + 4);
    *(undefined4 *)((long)&ec->l + 0x10) = *(undefined4 *)&(data->cb_cs_ld).costs.end_array;
    *(undefined4 *)((long)&ec->l + 0x14) = uVar5;
    *(int *)((long)&ec->l + 0x18) = (int)sVar7;
    *(undefined4 *)((long)&ec->l + 0x1c) = uVar6;
    (ec->l).simple.label = fVar1;
    (ec->l).simple.weight = fVar2;
    (ec->l).simple.initial = fVar3;
    *(undefined4 *)((long)&ec->l + 0xc) = uVar4;
    (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
    if (local_48.costs._end != local_48.costs._begin) {
      lVar10 = 0;
      uVar11 = 0;
      do {
        *(undefined4 *)((long)&(local_48.costs._begin)->partial_prediction + lVar10) =
             *(undefined4 *)((long)&((cs_ld->costs)._begin)->partial_prediction + lVar10);
        uVar11 = uVar11 + 1;
        lVar10 = lVar10 + 0x10;
      } while (uVar11 < (ulong)((long)local_48.costs._end - (long)local_48.costs._begin >> 4));
    }
    (ec->l).cs.costs.end_array = (wclass *)local_48.costs.end_array;
    (ec->l).cs.costs.erase_count = local_48.costs.erase_count;
    (ec->l).cs.costs._begin = (wclass *)local_48.costs._begin;
    (ec->l).cs.costs._end = (wclass *)local_48.costs._end;
  }
  return;
}

Assistant:

void predict_or_learn(cb& data, single_learner& base, example& ec)
{
  CB::label ld = ec.l.cb;
  cb_to_cs& c = data.cbcs;
  c.known_cost = get_observed_cost(ld);
  if (c.known_cost != nullptr && (c.known_cost->action < 1 || c.known_cost->action > c.num_actions))
    cerr << "invalid action: " << c.known_cost->action << endl;

  // generate a cost-sensitive example to update classifiers
  gen_cs_example<is_learn>(c, ec, ld, data.cb_cs_ld);

  if (c.cb_type != CB_TYPE_DM)
  {
    ec.l.cs = data.cb_cs_ld;

    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);

    for (size_t i = 0; i < ld.costs.size(); i++)
      ld.costs[i].partial_prediction = data.cb_cs_ld.costs[i].partial_prediction;
    ec.l.cb = ld;
  }
}